

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall cs_impl::any::make<cs::pointer,cs_impl::any>(any *this,any *args)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  any local_28;
  
  if ((_DAT_0033dee8 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x10);
  }
  else {
    pbVar1 = *(baseHolder **)(&holder<cs::structure>::allocator + _DAT_0033dee8 * 8);
    _DAT_0033dee8 = _DAT_0033dee8 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_0032d370;
  ppVar2 = args->mDat;
  args->mDat = (proxy *)0x0;
  pbVar1[1]._vptr_baseHolder = (_func_int **)ppVar2;
  local_28.mDat = (proxy *)0x0;
  recycle(&local_28);
  if ((DAT_00344820 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_00344820];
    DAT_00344820 = DAT_00344820 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 0;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}